

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManEquivCountClasses(Gia_Man_t *p)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  iVar1 = 0;
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (iVar1 = 0, 1 < (long)p->nObjs)) {
    iVar1 = 0;
    lVar2 = 1;
    do {
      uVar3 = 0;
      if ((~(uint)p->pReprs[lVar2] & 0xfffffff) == 0) {
        uVar3 = (uint)(0 < p->pNexts[lVar2]);
      }
      iVar1 = iVar1 + uVar3;
      lVar2 = lVar2 + 1;
    } while (p->nObjs != lVar2);
  }
  return iVar1;
}

Assistant:

int Gia_ManEquivCountClasses( Gia_Man_t * p )
{
    int i, Counter = 0;
    if ( p->pReprs == NULL )
        return 0;
    for ( i = 1; i < Gia_ManObjNum(p); i++ )
        Counter += Gia_ObjIsHead(p, i);
    return Counter;
}